

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,char_const(&)[19],int,std::__cxx11::string,char_const(&)[80]>
          (ValidationContext *this,IssueError *issue,uint *args,char (*args_1) [19],int *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [80])

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar1;
  string_view fmt;
  format_args args_00;
  allocator<char> local_d1;
  undefined1 local_d0 [40];
  string local_a8;
  ulong local_88 [2];
  char (*local_78) [19];
  ulong local_68;
  pointer local_58;
  size_type sStack_50;
  char (*local_48) [80];
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_d0[0] = (issue->super_Issue).type;
  local_d0._2_2_ = (issue->super_Issue).id;
  aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )args_3;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_d0 + 8),&(issue->super_Issue).message,&local_d1);
  local_88[0] = (ulong)*args;
  local_68 = (ulong)(uint)*args_2;
  local_58 = (args_3->_M_dataplus)._M_p;
  sStack_50 = args_3->_M_string_length;
  local_48 = args_4;
  fmt.size_ = 0xcd1c2;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.values_ = aVar1.values_;
  args_00.desc_ = (unsigned_long_long)local_88;
  local_78 = args_1;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_a8,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_d0);
  ValidationReport::~ValidationReport((ValidationReport *)local_d0);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }